

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O0

Scal __thiscall LinearExpert::queryXafterZ(LinearExpert *this,X *x)

{
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_RDI;
  ReturnType RVar1;
  double dVar2;
  Scalar __x;
  double dVar3;
  X xInvVar;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_ffffffffffffff38;
  Scal SVar4;
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_stack_ffffffffffffff40;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_ffffffffffffff48;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_00;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_ffffffffffffff68;
  double *in_stack_ffffffffffffff90;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_28 [40];
  
  this_00 = local_28;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-(in_stack_ffffffffffffff68,in_RDI);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffff40,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)in_stack_ffffffffffffff38);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator/
            ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             (*(double *)(in_RDI + 0x188) + 1.0),in_stack_ffffffffffffff90);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffff40,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)in_stack_ffffffffffffff38);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::cwiseAbs2(this_00);
  RVar1 = Eigen::
          MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>
          ::dot<Eigen::Matrix<double,_1,1,0,_1,1>>
                    (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  dVar2 = exp(RVar1 * -0.5);
  *(double *)(in_RDI + 0x158) = dVar2;
  *(double *)(in_RDI + 0x160) = *(double *)(in_RDI + 0x150) * *(double *)(in_RDI + 0x158);
  dVar2 = *(double *)(in_RDI + 0x138) * *(double *)(in_RDI + 0x158);
  __x = Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::prod(in_stack_ffffffffffffff48);
  dVar3 = sqrt(__x);
  *(double *)(in_RDI + 0x148) = dVar2 * dVar3;
  SVar4 = *(Scal *)(in_RDI + 0x148);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x3064e5);
  return SVar4;
}

Assistant:

EXPERT_CLASS_TEMPLATE
Scal LINEAR_EXPERT_base::queryXafterZ( X const &x )
{
    dx = x - pred_x;

    X xInvVar = invPsi / (1.0 + gamma);

    rbf_x = exp(-0.5*dx.cwiseAbs2().dot(xInvVar));
    rbf_zx = rbf_z * rbf_x;
    p_zx = p_z_T * rbf_x * sqrt(xInvVar.prod());

    return p_zx;
}